

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::require_texture_query_variant(CompilerHLSL *this,uint32_t var_id)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  ImageFormat fmt;
  uint uVar4;
  SPIRVariable *pSVar5;
  SPIRType *pSVar6;
  SPIRType *pSVar7;
  runtime_error *prVar8;
  ulong uVar9;
  long lVar10;
  TextureSizeVariants *pTVar11;
  bool bVar12;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pSVar5 = Compiler::maybe_get_backing_variable((Compiler *)this,var_id);
  if (pSVar5 != (SPIRVariable *)0x0) {
    var_id = (pSVar5->super_IVariant).self.id;
  }
  pSVar6 = Compiler::expression_type((Compiler *)this,var_id);
  uVar2 = (pSVar6->image).sampled;
  bVar12 = uVar2 == 2;
  if (this->field_0x2424 == '\x01') {
    bVar12 = Compiler::has_decoration((Compiler *)this,(ID)var_id,DecorationNonWritable);
    bVar12 = (bool)(~bVar12 & uVar2 == 2);
  }
  switch((pSVar6->image).dim) {
  case Dim1D:
    uVar9 = (ulong)(pSVar6->image).arrayed;
    break;
  case Dim2D:
    bVar1 = (pSVar6->image).arrayed;
    if ((pSVar6->image).ms == true) {
      uVar9 = (ulong)(bVar1 | 8);
    }
    else {
      uVar9 = (ulong)(bVar1 | 2);
    }
    break;
  case Dim3D:
    uVar9 = 4;
    break;
  case DimCube:
    uVar9 = (ulong)((pSVar6->image).arrayed | 6);
    break;
  default:
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Unsupported query type.","");
    ::std::runtime_error::runtime_error(prVar8,(string *)local_48);
    *(undefined ***)prVar8 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case DimBuffer:
    uVar9 = 5;
  }
  pSVar7 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (pSVar6->image).type.id);
  iVar3 = *(int *)&(pSVar7->super_IVariant).field_0xc;
  if (iVar3 != 0xd) {
    if (iVar3 == 8) {
      uVar9 = (ulong)((uint)uVar9 | 0x20);
    }
    else {
      if (iVar3 != 7) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_48[0] = local_38;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"Unsupported query type.","");
        ::std::runtime_error::runtime_error(prVar8,(string *)local_48);
        *(undefined ***)prVar8 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar9 = (ulong)((uint)uVar9 | 0x10);
    }
  }
  fmt = (pSVar6->image).format;
  uVar4 = fmt - ImageFormatRgba8;
  if (uVar4 < 0x11) {
    lVar10 = *(long *)(&DAT_002e13f8 + (ulong)uVar4 * 8);
  }
  else {
    lVar10 = 0;
  }
  if (bVar12 == false) {
    pTVar11 = &this->required_texture_size_variants;
  }
  else {
    uVar4 = image_format_to_components(fmt);
    pTVar11 = (TextureSizeVariants *)
              ((this->required_texture_size_variants).uav[lVar10] + (uVar4 - 1));
  }
  if ((pTVar11->srv >> (uVar9 & 0x3f) & 1) == 0) {
    Compiler::force_recompile((Compiler *)this);
    pTVar11->srv = pTVar11->srv | 1L << ((byte)uVar9 & 0x3f);
  }
  return;
}

Assistant:

void CompilerHLSL::require_texture_query_variant(uint32_t var_id)
{
	if (const auto *var = maybe_get_backing_variable(var_id))
		var_id = var->self;

	auto &type = expression_type(var_id);
	bool uav = type.image.sampled == 2;
	if (hlsl_options.nonwritable_uav_texture_as_srv && has_decoration(var_id, DecorationNonWritable))
		uav = false;

	uint32_t bit = 0;
	switch (type.image.dim)
	{
	case Dim1D:
		bit = type.image.arrayed ? Query1DArray : Query1D;
		break;

	case Dim2D:
		if (type.image.ms)
			bit = type.image.arrayed ? Query2DMSArray : Query2DMS;
		else
			bit = type.image.arrayed ? Query2DArray : Query2D;
		break;

	case Dim3D:
		bit = Query3D;
		break;

	case DimCube:
		bit = type.image.arrayed ? QueryCubeArray : QueryCube;
		break;

	case DimBuffer:
		bit = QueryBuffer;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	switch (get<SPIRType>(type.image.type).basetype)
	{
	case SPIRType::Float:
		bit += QueryTypeFloat;
		break;

	case SPIRType::Int:
		bit += QueryTypeInt;
		break;

	case SPIRType::UInt:
		bit += QueryTypeUInt;
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported query type.");
	}

	auto norm_state = image_format_to_normalized_state(type.image.format);
	auto &variant = uav ? required_texture_size_variants
	                          .uav[uint32_t(norm_state)][image_format_to_components(type.image.format) - 1] :
	                      required_texture_size_variants.srv;

	uint64_t mask = 1ull << bit;
	if ((variant & mask) == 0)
	{
		force_recompile();
		variant |= mask;
	}
}